

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * __thiscall
lest::to_string<nonstd::expected_lite::expected<int,char>,nonstd::expected_lite::expected<int,char>>
          (string *__return_storage_ptr__,lest *this,expected<int,_char> *lhs,string *op,
          expected<int,_char> *rhs)

{
  ostream *poVar1;
  expected<int,_char> *item;
  expected<int,_char> *item_00;
  ostringstream os;
  ForStreamable<nonstd::expected_lite::expected<int,_char>,_std::string> local_1d8;
  ForStreamable<nonstd::expected_lite::expected<int,_char>,_std::string> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  make_string<nonstd::expected_lite::expected<int,char>>(&local_1b8,this,item);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)(lhs->contained).super_storage_t_impl<int,_char>,
                      (long)lhs[1].contained.super_storage_t_impl<int,_char>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  make_string<nonstd::expected_lite::expected<int,char>>(&local_1d8,(lest *)op,item_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}